

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

char ** vrna_strsplit(char *string,char *delimiter)

{
  int iVar1;
  char *__s;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  uint size;
  char *save;
  char local_3a [2];
  char *local_38;
  
  if (string == (char *)0x0) {
    ppcVar2 = (char **)0x0;
  }
  else {
    if ((delimiter == (char *)0x0) || (cVar5 = *delimiter, cVar5 == '\0')) {
      cVar5 = '&';
    }
    local_3a[1] = 0;
    local_3a[0] = cVar5;
    __s = strdup(string);
    if (*__s == '\0') {
      size = 0x10;
    }
    else {
      iVar1 = 0;
      pcVar3 = __s;
      do {
        pcVar3 = pcVar3 + 1;
        iVar1 = iVar1 + (uint)(*pcVar3 == cVar5);
      } while (*pcVar3 != '\0');
      size = iVar1 * 8 + 0x10;
    }
    ppcVar2 = (char **)vrna_alloc(size);
    pcVar3 = strtok_r(__s,local_3a,&local_38);
    uVar4 = 0;
    if (pcVar3 != (char *)0x0) {
      uVar6 = 0;
      do {
        pcVar3 = vrna_strdup_printf("%s",pcVar3);
        uVar4 = (ulong)((int)uVar6 + 1);
        ppcVar2[uVar6] = pcVar3;
        pcVar3 = strtok_r((char *)0x0,local_3a,&local_38);
        uVar6 = uVar4;
      } while (pcVar3 != (char *)0x0);
    }
    ppcVar2[uVar4] = (char *)0x0;
    free(__s);
  }
  return ppcVar2;
}

Assistant:

PUBLIC char **
vrna_strsplit(const char  *string,
              const char  *delimiter)
{
  char          delim[2], *ptr, *ptr2, *token, *save, **split;
  unsigned int  n;

  split = NULL;
  n     = 0;

  if (string) {
    if ((delimiter) && (*delimiter))
      delim[0] = *delimiter;
    else
      delim[0] = '&';

    delim[1] = '\0';

    /* copy string such that we can alter it via strtok() */
    ptr2 = strdup(string);

    /* count how many elements we'll extract */
    ptr = ptr2;

    while (*ptr++)
      if (*ptr == *delim)
        n++;

    /*
     * allocate (n + 1) + 1 elements in split list
     * n + 1 elements plus 1 additional element to indicate
     * the last element in split
     */
    split = (char **)vrna_alloc(sizeof(char *) * (n + 2));

    n     = 0;
    token = strtok_r(ptr2, delim, &save);

    while (token != NULL) {
      split[n++]  = vrna_strdup_printf("%s", token);
      token       = strtok_r(NULL, delim, &save);
    }

    split[n] = NULL;

    free(ptr2);
  }

  return split;
}